

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  doh_probes *pdVar1;
  DOHcode DVar2;
  CURLcode CVar3;
  uchar *doh;
  size_t dohlen;
  char *pcVar4;
  char *pcVar5;
  Curl_addrinfo *local_2c8;
  Curl_addrinfo *ai;
  Curl_dns_entry *dns;
  doh_response *p;
  undefined1 local_2a8 [4];
  int slot;
  dohentry de;
  DOHcode rc [2];
  doh_probes *dohp;
  CURLcode result;
  Curl_dns_entry **dnsp_local;
  Curl_easy *data_local;
  
  pdVar1 = (data->state).async.doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar1 == (doh_probes *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar1->probe_resp[0].probe_mid == 0xffffffff) &&
          (pdVar1->probe_resp[1].probe_mid == 0xffffffff)) {
    Curl_failf(data,"Could not DoH-resolve: %s",pdVar1->host);
    data_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
    if (((ulong)data->conn->bits >> 4 & 1) != 0) {
      data_local._4_4_ = CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else if (pdVar1->pending == 0) {
    Curl_resolv_unlink(data,&(data->state).async.dns);
    memset(&de.numcname,0,8);
    Curl_doh_close(data);
    de_init((dohentry *)local_2a8);
    for (p._4_4_ = 0; p._4_4_ < 2; p._4_4_ = p._4_4_ + 1) {
      dns = (Curl_dns_entry *)(pdVar1->probe_resp + p._4_4_);
      if ((int)dns[1].timestamp != 0) {
        doh = Curl_dyn_uptr((dynbuf *)&dns->timestamp);
        dohlen = Curl_dyn_len((dynbuf *)&dns->timestamp);
        DVar2 = doh_resp_decode(doh,dohlen,(DNStype)dns[1].timestamp,(dohentry *)local_2a8);
        rc[(long)p._4_4_ + -2] = DVar2;
        if ((((rc[(long)p._4_4_ + -2] != DOH_OK) && (data != (Curl_easy *)0x0)) &&
            ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
           (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))))
        {
          pcVar4 = doh_strerror(rc[(long)p._4_4_ + -2]);
          pcVar5 = doh_type2name((DNStype)dns[1].timestamp);
          Curl_infof(data,"DoH: %s type %s for %s",pcVar4,pcVar5,pdVar1->host);
        }
      }
    }
    dohp._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
    if ((de.numcname == 0) || (de._620_4_ == 0)) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
          (0 < Curl_trc_feat_dns.log_level)))) {
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && (0 < Curl_trc_feat_dns.log_level)) {
          Curl_trc_dns(data,"hostname: %s",pdVar1->host);
        }
        doh_show(data,(dohentry *)local_2a8);
      }
      CVar3 = doh2ai((dohentry *)local_2a8,pdVar1->host,pdVar1->port,&local_2c8);
      if (CVar3 != CURLE_OK) {
        de_cleanup((dohentry *)local_2a8);
        return CVar3;
      }
      ai = (Curl_addrinfo *)Curl_dnscache_mk_entry(data,local_2c8,pdVar1->host,0,pdVar1->port,false)
      ;
      dohp._4_4_ = CURLE_OK;
      if (ai != (Curl_addrinfo *)0x0) {
        (data->state).async.dns = (Curl_dns_entry *)ai;
        dohp._4_4_ = Curl_dnscache_add(data,(Curl_dns_entry *)ai);
        *dnsp = (data->state).async.dns;
      }
    }
    (data->state).async.field_0x28 = (data->state).async.field_0x28 & 0xfe | 1;
    de_cleanup((dohentry *)local_2a8);
    Curl_doh_cleanup(data);
    data_local._4_4_ = dohp._4_4_;
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct doh_probes *dohp = data->state.async.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(dohp->probe_resp[DOH_SLOT_IPV4].probe_mid == UINT_MAX &&
     dohp->probe_resp[DOH_SLOT_IPV6].probe_mid == UINT_MAX) {
    failf(data, "Could not DoH-resolve: %s", dohp->host);
    return CONN_IS_PROXIED(data->conn) ? CURLE_COULDNT_RESOLVE_PROXY :
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_SLOT_COUNT];
    struct dohentry de;
    int slot;

    /* Clear any result the might still be there */
    Curl_resolv_unlink(data, &data->state.async.dns);

    memset(rc, 0, sizeof(rc));
    /* remove DoH handles from multi handle and close them */
    Curl_doh_close(data);
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      struct doh_response *p = &dohp->probe_resp[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_resp_decode(Curl_dyn_uptr(&p->body),
                                 Curl_dyn_len(&p->body),
                                 p->dnstype, &de);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              doh_type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_SLOT_IPV4] || !rc[DOH_SLOT_IPV6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;


      if(Curl_trc_ft_is_verbose(data, &Curl_trc_feat_dns)) {
        CURL_TRC_DNS(data, "hostname: %s", dohp->host);
        doh_show(data, &de);
      }

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      /* we got a response, create a dns entry. */
      dns = Curl_dnscache_mk_entry(data, ai, dohp->host, 0, dohp->port, FALSE);
      if(dns) {
        /* Now add and HTTPSRR information if we have */
#ifdef USE_HTTPSRR
        if(de.numhttps_rrs > 0 && result == CURLE_OK) {
          struct Curl_https_rrinfo *hrr = NULL;
          result = doh_resp_decode_httpsrr(data, de.https_rrs->val,
                                           de.https_rrs->len, &hrr);
          if(result) {
            infof(data, "Failed to decode HTTPS RR");
            return result;
          }
          infof(data, "Some HTTPS RR to process");
# ifdef DEBUGBUILD
          doh_print_httpsrr(data, hrr);
# endif
          dns->hinfo = hrr;
       }
#endif
        /* and add the entry to the cache */
        data->state.async.dns = dns;
        result = Curl_dnscache_add(data, dns);
        *dnsp = data->state.async.dns;
      }
    } /* address processing done */

    /* All done */
    data->state.async.done = TRUE;
    de_cleanup(&de);
    Curl_doh_cleanup(data);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}